

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_util.h
# Opt level: O0

uint64_t avx512_vpopcount(__m512i *data,uint64_t size)

{
  __m512i v;
  uint64_t uVar1;
  ulong in_RSI;
  long in_RDI;
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  __m512i p3;
  __m512i v3;
  __m512i p2;
  __m512i v2;
  __m512i p1;
  __m512i v1;
  __m512i p0;
  __m512i v0;
  uint64_t i;
  __m512i total;
  uint64_t limit;
  undefined1 in_stack_fffffffffffff100 [56];
  undefined1 local_ec0 [64];
  undefined1 local_e80 [64];
  undefined1 local_e40 [64];
  undefined1 local_e00 [64];
  undefined1 local_dc0 [64];
  undefined1 local_d80 [64];
  undefined1 local_d40 [64];
  undefined1 local_d00 [64];
  undefined1 local_cc0 [64];
  undefined1 local_c80 [64];
  undefined1 local_c40 [64];
  undefined1 local_c00 [64];
  undefined1 local_bc0 [64];
  undefined1 local_b80 [64];
  undefined1 local_b40 [64];
  undefined1 local_b00 [64];
  undefined1 local_ac0 [64];
  undefined1 local_a80 [64];
  undefined1 local_a40 [64];
  undefined1 local_a00 [64];
  undefined1 local_9c0 [64];
  undefined1 local_980 [64];
  ulong local_908;
  undefined1 local_900 [64];
  ulong local_898;
  ulong local_890;
  long local_888;
  undefined1 local_880 [64];
  undefined1 (*local_828) [64];
  undefined1 (*local_820) [64];
  undefined1 (*local_818) [64];
  undefined1 (*local_810) [64];
  undefined1 (*local_808) [64];
  undefined1 local_800 [64];
  undefined1 local_7c0 [64];
  undefined1 local_780 [64];
  undefined1 local_740 [64];
  undefined1 local_700 [64];
  undefined1 local_6c0 [64];
  undefined1 local_680 [64];
  undefined1 local_640 [64];
  undefined1 local_600 [64];
  undefined1 local_5c0 [64];
  undefined1 local_580 [64];
  undefined1 local_540 [64];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  local_898 = in_RSI & 0xfffffffffffffffc;
  local_880 = vmovdqa64_avx512f(ZEXT1664(ZEXT816(0) << 0x40));
  auVar2 = vmovdqa64_avx512f(local_880);
  local_900 = vmovdqa64_avx512f(auVar2);
  local_890 = in_RSI;
  local_888 = in_RDI;
  for (local_908 = 0; local_908 < local_898; local_908 = local_908 + 4) {
    local_808 = (undefined1 (*) [64])(local_888 + local_908 * 0x40);
    auVar2 = vmovdqu64_avx512f(*local_808);
    local_980 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(local_980);
    local_a00 = vmovdqa64_avx512f(auVar2);
    memcpy(local_600,local_a00,0x40);
    auVar2 = vmovdqa64_avx512f(local_600);
    local_5c0 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(local_5c0);
    auVar2 = vpopcntq_avx512_vpopcntdq(auVar2);
    local_9c0 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(local_900);
    auVar3 = vmovdqa64_avx512f(local_9c0);
    local_a40 = vmovdqa64_avx512f(auVar2);
    local_a80 = vmovdqa64_avx512f(auVar3);
    memcpy(local_140,local_a80,0x40);
    memcpy(local_180,local_a40,0x40);
    auVar2 = vmovdqa64_avx512f(local_180);
    auVar3 = vmovdqa64_avx512f(local_140);
    local_c0 = vmovdqa64_avx512f(auVar2);
    local_100 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(local_c0);
    auVar2 = vpaddq_avx512f(auVar2,local_100);
    local_900 = vmovdqa64_avx512f(auVar2);
    local_810 = (undefined1 (*) [64])(local_888 + local_908 * 0x40 + 0x40);
    auVar2 = vmovdqu64_avx512f(*local_810);
    local_ac0 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(local_ac0);
    local_b40 = vmovdqa64_avx512f(auVar2);
    memcpy(local_680,local_b40,0x40);
    auVar2 = vmovdqa64_avx512f(local_680);
    local_640 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(local_640);
    auVar2 = vpopcntq_avx512_vpopcntdq(auVar2);
    local_b00 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(local_900);
    auVar3 = vmovdqa64_avx512f(local_b00);
    local_b80 = vmovdqa64_avx512f(auVar2);
    local_bc0 = vmovdqa64_avx512f(auVar3);
    memcpy(local_240,local_bc0,0x40);
    memcpy(local_280,local_b80,0x40);
    auVar2 = vmovdqa64_avx512f(local_280);
    auVar3 = vmovdqa64_avx512f(local_240);
    local_1c0 = vmovdqa64_avx512f(auVar2);
    local_200 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(local_1c0);
    auVar2 = vpaddq_avx512f(auVar2,local_200);
    local_900 = vmovdqa64_avx512f(auVar2);
    local_818 = (undefined1 (*) [64])(local_888 + local_908 * 0x40 + 0x80);
    auVar2 = vmovdqu64_avx512f(*local_818);
    local_c00 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(local_c00);
    local_c80 = vmovdqa64_avx512f(auVar2);
    memcpy(local_700,local_c80,0x40);
    auVar2 = vmovdqa64_avx512f(local_700);
    local_6c0 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(local_6c0);
    auVar2 = vpopcntq_avx512_vpopcntdq(auVar2);
    local_c40 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(local_900);
    auVar3 = vmovdqa64_avx512f(local_c40);
    local_cc0 = vmovdqa64_avx512f(auVar2);
    local_d00 = vmovdqa64_avx512f(auVar3);
    memcpy(local_340,local_d00,0x40);
    memcpy(local_380,local_cc0,0x40);
    auVar2 = vmovdqa64_avx512f(local_380);
    auVar3 = vmovdqa64_avx512f(local_340);
    local_2c0 = vmovdqa64_avx512f(auVar2);
    local_300 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(local_2c0);
    auVar2 = vpaddq_avx512f(auVar2,local_300);
    local_900 = vmovdqa64_avx512f(auVar2);
    local_820 = (undefined1 (*) [64])(local_888 + local_908 * 0x40 + 0xc0);
    auVar2 = vmovdqu64_avx512f(*local_820);
    local_d40 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(local_d40);
    local_dc0 = vmovdqa64_avx512f(auVar2);
    memcpy(local_780,local_dc0,0x40);
    auVar2 = vmovdqa64_avx512f(local_780);
    local_740 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(local_740);
    auVar2 = vpopcntq_avx512_vpopcntdq(auVar2);
    local_d80 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(local_900);
    auVar3 = vmovdqa64_avx512f(local_d80);
    local_e00 = vmovdqa64_avx512f(auVar2);
    local_e40 = vmovdqa64_avx512f(auVar3);
    memcpy(local_440,local_e40,0x40);
    memcpy(local_480,local_e00,0x40);
    auVar2 = vmovdqa64_avx512f(local_480);
    auVar3 = vmovdqa64_avx512f(local_440);
    local_3c0 = vmovdqa64_avx512f(auVar2);
    local_400 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(local_3c0);
    auVar2 = vpaddq_avx512f(auVar2,local_400);
    local_900 = vmovdqa64_avx512f(auVar2);
  }
  for (; local_908 < local_890; local_908 = local_908 + 1) {
    auVar2 = vmovdqa64_avx512f(local_900);
    local_828 = (undefined1 (*) [64])(local_888 + local_908 * 0x40);
    auVar3 = vmovdqu64_avx512f(*local_828);
    local_e80 = vmovdqa64_avx512f(auVar3);
    memcpy(local_800,local_e80,0x40);
    auVar3 = vmovdqa64_avx512f(local_800);
    local_7c0 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(local_7c0);
    auVar3 = vpopcntq_avx512_vpopcntdq(auVar3);
    local_ec0 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar3);
    in_stack_fffffffffffff100 = auVar2._0_56_;
    memcpy(local_540,&stack0xfffffffffffff100,0x40);
    memcpy(local_580,local_ec0,0x40);
    auVar2 = vmovdqa64_avx512f(local_580);
    auVar3 = vmovdqa64_avx512f(local_540);
    local_4c0 = vmovdqa64_avx512f(auVar2);
    local_500 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(local_4c0);
    auVar2 = vpaddq_avx512f(auVar2,local_500);
    local_900 = vmovdqa64_avx512f(auVar2);
  }
  auVar2 = vmovdqa64_avx512f(local_900);
  auVar2 = vmovdqa64_avx512f(auVar2);
  auVar3 = vmovdqa64_avx512f(auVar2);
  vmovdqa64_avx512f(auVar3);
  v[1] = in_stack_fffffffffffff100._0_8_;
  v[2] = in_stack_fffffffffffff100._8_8_;
  v[3] = in_stack_fffffffffffff100._16_8_;
  v[4] = in_stack_fffffffffffff100._24_8_;
  v[5] = in_stack_fffffffffffff100._32_8_;
  v[6] = in_stack_fffffffffffff100._40_8_;
  v[7] = in_stack_fffffffffffff100._48_8_;
  v[0] = auVar2._56_8_;
  uVar1 = simd_sum_epu64(v);
  return uVar1;
}

Assistant:

static inline uint64_t avx512_vpopcount(const __m512i *data,
                                        const uint64_t size) {
    const uint64_t limit = size - size % 4;
    __m512i total = _mm512_setzero_si512();
    uint64_t i = 0;

    for (; i < limit; i += 4) {
        VPOPCNT_AND_ADD(data + i, 0, total);
        VPOPCNT_AND_ADD(data + i, 1, total);
        VPOPCNT_AND_ADD(data + i, 2, total);
        VPOPCNT_AND_ADD(data + i, 3, total);
    }

    for (; i < size; i++) {
        total = _mm512_add_epi64(
            total, _mm512_popcnt_epi64(_mm512_loadu_si512(data + i)));
    }

    return simd_sum_epu64(total);
}